

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterDenseDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  DataKey DVar6;
  DataKey DVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  lVar9 = (long)(pSVar3->thecovectors->set).thenum;
  if (lVar9 < 1) {
    DVar7.info = 0;
    DVar7.idx = -1;
  }
  else {
    pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0xffffffff;
    lVar10 = 0;
    DVar6.info = 0;
    DVar6.idx = 0;
    do {
      dVar1 = pdVar4[lVar10];
      if (dVar1 < -tol) {
        dVar2 = pdVar5[lVar10];
        dVar11 = tol;
        if (tol <= dVar2) {
          dVar11 = dVar2;
        }
        dVar11 = (dVar1 * dVar1) / dVar11;
        if (*best <= dVar11 && dVar11 != *best) {
          *best = dVar11;
          DVar6 = (DataKey)SPxSolverBase<double>::coId
                                     ((this->super_SPxPricer<double>).thesolver,(int)lVar10);
          uVar8 = (ulong)DVar6 >> 0x20;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    DVar7 = (DataKey)((ulong)DVar6 & 0xffffffff | uVar8 << 0x20);
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}